

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mulmod.c
# Opt level: O1

int main(void)

{
  uint64_t uVar1;
  
  uVar1 = mulmod(0x7b,0x1c8,7);
  if (((uVar1 == 4) && (uVar1 = mulmod(0xf1206,0xd431,0xa29c38729), uVar1 == 0x2540be3fd)) &&
     (uVar1 = mulmod(0xffffffffffffffff,0xffffffffffffffff,0x1000000000000021), uVar1 == 0x44521)) {
    return 0;
  }
  return 1;
}

Assistant:

int main() {

    // test with small numbers

    if(mulmod(123, 456, 7) != 4)
        goto error;

    if(mulmod(987654, 54321, 43650352937) != 9999999997)
        goto error;

    // test with 64 bit numbers

    if(mulmod(0xffffffffffffffff, 0xffffffffffffffff, 1152921504606847009) != 279841)
        goto error;

    return 0;


    error:
        return 1;

}